

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainSimpleCount(Parse *pParse,Table *pTab,Index *pIdx)

{
  char *pcVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Parse *in_RDI;
  bool bVar2;
  int bCover;
  char *local_40;
  
  if (in_RDI->explain == '\x02') {
    bVar2 = false;
    if ((in_RDX != (undefined8 *)0x0) && (bVar2 = true, (*(uint *)(in_RSI + 8) & 0x20) != 0)) {
      bVar2 = (*(ushort *)((long)in_RDX + 99) & 3) != 2;
    }
    pcVar1 = "";
    if (bVar2) {
      pcVar1 = " USING COVERING INDEX ";
      local_40 = (char *)*in_RDX;
    }
    else {
      local_40 = "";
    }
    sqlite3VdbeExplain(in_RDI,'\0',"SCAN TABLE %s%s%s",*in_RSI,pcVar1,local_40);
  }
  return;
}

Assistant:

static void explainSimpleCount(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being queried */
  Index *pIdx                     /* Index used to optimize scan, or NULL */
){
  if( pParse->explain==2 ){
    int bCover = (pIdx!=0 && (HasRowid(pTab) || !IsPrimaryKeyIndex(pIdx)));
    sqlite3VdbeExplain(pParse, 0, "SCAN TABLE %s%s%s",
        pTab->zName,
        bCover ? " USING COVERING INDEX " : "",
        bCover ? pIdx->zName : ""
    );
  }
}